

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

void __thiscall
pstore::database::database<pstore::file::in_memory>
          (database *this,shared_ptr<pstore::file::in_memory> *file,bool access_tick_enabled)

{
  unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_> local_38;
  unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_> local_30;
  unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  local_28;
  byte local_19;
  shared_ptr<pstore::file::in_memory> *psStack_18;
  bool access_tick_enabled_local;
  shared_ptr<pstore::file::in_memory> *file_local;
  database *this_local;
  
  local_19 = access_tick_enabled;
  psStack_18 = file;
  file_local = (shared_ptr<pstore::file::in_memory> *)this;
  std::make_unique<pstore::system_page_size>();
  std::
  unique_ptr<pstore::system_page_size_interface,std::default_delete<pstore::system_page_size_interface>>
  ::unique_ptr<pstore::system_page_size,std::default_delete<pstore::system_page_size>,void>
            ((unique_ptr<pstore::system_page_size_interface,std::default_delete<pstore::system_page_size_interface>>
              *)&local_28,&local_30);
  region::get_factory((region *)&local_38,psStack_18,0x100000000,0x400000);
  database<pstore::file::in_memory>(this,file,&local_28,&local_38,(bool)(local_19 & 1));
  std::unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>::
  ~unique_ptr(&local_38);
  std::
  unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ::~unique_ptr(&local_28);
  std::unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_>::
  ~unique_ptr(&local_30);
  return;
}

Assistant:

explicit database (std::shared_ptr<File> const & file, bool access_tick_enabled = true)
                : database (file, std::make_unique<system_page_size> (),
                            region::get_factory (file, storage::full_region_size,
                                                 storage::min_region_size),
                            access_tick_enabled) {}